

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O2

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  cmake *pcVar6;
  cmMessenger *this_00;
  bool local_88;
  MessageType local_84;
  MessageType local_80;
  allocator<char> local_7a;
  allocator<char> local_79;
  string message;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  _Elt_pointer local_38;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,"called with incorrect number of arguments",
               (allocator<char> *)&stack0xffffffffffffffa8);
    cmCommand::SetError(&this->super_cmCommand,&message);
  }
  else {
    bVar3 = std::operator==(__lhs,"SEND_ERROR");
    local_38 = (_Elt_pointer)0x20;
    local_80 = FATAL_ERROR;
    if (bVar3) {
      local_88 = false;
      local_84 = AUTHOR_ERROR;
LAB_001acf95:
      bVar4 = false;
      bVar3 = false;
    }
    else {
      bVar3 = std::operator==(__lhs,"FATAL_ERROR");
      if (bVar3) {
        local_88 = true;
LAB_001acf5a:
        local_84 = AUTHOR_ERROR;
        goto LAB_001acf95;
      }
      bVar3 = std::operator==(__lhs,"WARNING");
      local_84 = FATAL_ERROR;
      if (bVar3) {
        local_84 = FATAL_ERROR;
        local_80 = WARNING;
        local_88 = false;
        goto LAB_001acf95;
      }
      bVar3 = std::operator==(__lhs,"AUTHOR_WARNING");
      if (bVar3) {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&message,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_79);
        bVar3 = cmMakefile::IsSet(pcVar2,&message);
        if (bVar3) {
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xffffffffffffffa8,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_7a)
          ;
          local_88 = cmMakefile::IsOn(pcVar2,(string *)&stack0xffffffffffffffa8);
          local_88 = !local_88;
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
        }
        else {
          local_88 = false;
        }
        std::__cxx11::string::~string((string *)&message);
        if (local_88 == false) {
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&message,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                     (allocator<char> *)&stack0xffffffffffffffa8);
          bVar5 = cmMakefile::IsOn(pcVar2,&message);
          std::__cxx11::string::~string((string *)&message);
          bVar4 = false;
          bVar3 = false;
          local_80 = AUTHOR_WARNING;
          if (bVar5) goto LAB_001ad0fa;
        }
        else {
          bVar4 = false;
          bVar3 = false;
          local_84 = AUTHOR_ERROR;
          local_80 = local_84;
        }
      }
      else {
        local_84 = FATAL_ERROR;
        bVar4 = std::operator==(__lhs,"STATUS");
        bVar3 = true;
        local_80 = MESSAGE;
        if (bVar4) {
          local_88 = false;
          bVar4 = true;
          local_84 = MESSAGE;
          local_80 = MESSAGE;
        }
        else {
          bVar4 = std::operator==(__lhs,"VERBOSE");
          if (bVar4) {
            local_84 = WARNING;
          }
          else {
            bVar4 = std::operator==(__lhs,"DEBUG");
            if (bVar4) {
              local_84 = LOG;
            }
            else {
              bVar4 = std::operator==(__lhs,"TRACE");
              if (!bVar4) {
                bVar4 = std::operator==(__lhs,"DEPRECATION");
                if (bVar4) {
                  pcVar2 = (this->super_cmCommand).Makefile;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&message,"CMAKE_ERROR_DEPRECATED",
                             (allocator<char> *)&stack0xffffffffffffffa8);
                  local_88 = cmMakefile::IsOn(pcVar2,&message);
                  std::__cxx11::string::~string((string *)&message);
                  if (local_88) {
                    local_80 = DEPRECATION_ERROR;
                    goto LAB_001acf5a;
                  }
                  pcVar2 = (this->super_cmCommand).Makefile;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&message,"CMAKE_WARN_DEPRECATED",&local_79);
                  bVar3 = cmMakefile::IsSet(pcVar2,&message);
                  if (bVar3) {
                    pcVar2 = (this->super_cmCommand).Makefile;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&stack0xffffffffffffffa8,"CMAKE_WARN_DEPRECATED",&local_7a)
                    ;
                    bVar3 = cmMakefile::IsOn(pcVar2,(string *)&stack0xffffffffffffffa8);
                    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
                    std::__cxx11::string::~string((string *)&message);
                    if (!bVar3) goto LAB_001ad0fa;
                  }
                  else {
                    std::__cxx11::string::~string((string *)&message);
                  }
                  local_80 = DEPRECATION_WARNING;
                  goto LAB_001acf95;
                }
                bVar4 = std::operator==(__lhs,"NOTICE");
                local_38 = (_Elt_pointer)((ulong)bVar4 << 5);
                local_84 = INTERNAL_ERROR;
                bVar4 = false;
                local_88 = false;
                goto LAB_001acf97;
              }
              local_84 = DEPRECATION_ERROR;
            }
          }
          local_88 = false;
          bVar4 = true;
          local_80 = MESSAGE;
        }
      }
    }
LAB_001acf97:
    pcVar6 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    if (pcVar6->MessageLogLevel == LOG_UNDEFINED) {
      __assert_fail("\"Expected a valid log level here\" && desiredLevel != cmake::LogLevel::LOG_UNDEFINED"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMessageCommand.cxx"
                    ,99,
                    "virtual bool cmMessageCommand::InitialPass(const std::vector<std::string> &, cmExecutionStatus &)"
                   );
    }
    if ((int)pcVar6->MessageLogLevel < (int)local_84) goto LAB_001ad0fa;
    local_58._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&(local_38->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + (long)&(__lhs->_M_dataplus)._M_p);
    local_50._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&message,(cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&stack0xffffffffffffffa8,"");
    if (bVar3) {
      if (bVar4) {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,&message,-1.0);
      }
      else {
        cmSystemTools::Message(&message,(char *)0x0);
      }
    }
    else {
      this_00 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
      cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffa8);
      cmMessenger::DisplayMessage
                (this_00,local_80,&message,(cmListFileBacktrace *)&stack0xffffffffffffffa8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
    }
    if (local_88 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
  }
  std::__cxx11::string::~string((string *)&message);
LAB_001ad0fa:
  return __lhs != pbVar1;
}

Assistant:

bool cmMessageCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  auto i = args.cbegin();

  auto type = MessageType::MESSAGE;
  auto status = false;
  auto fatal = false;
  auto level = cmake::LogLevel::LOG_UNDEFINED;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    level = cmake::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    level = cmake::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    level = cmake::LogLevel::LOG_WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (this->Makefile->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
      level = cmake::LogLevel::LOG_ERROR;
    } else if (!this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
      level = cmake::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "STATUS") {
    status = true;
    level = cmake::LogLevel::LOG_STATUS;
    ++i;
  } else if (*i == "VERBOSE") {
    status = true;
    level = cmake::LogLevel::LOG_VERBOSE;
    ++i;
  } else if (*i == "DEBUG") {
    status = true;
    level = cmake::LogLevel::LOG_DEBUG;
    ++i;
  } else if (*i == "TRACE") {
    status = true;
    level = cmake::LogLevel::LOG_TRACE;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
      level = cmake::LogLevel::LOG_ERROR;
    } else if ((!this->Makefile->IsSet("CMAKE_WARN_DEPRECATED") ||
                this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))) {
      type = MessageType::DEPRECATION_WARNING;
      level = cmake::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "NOTICE") {
    // `NOTICE` message type is going to be output to stderr
    level = cmake::LogLevel::LOG_NOTICE;
    ++i;
  } else {
    // Messages w/o any type are `NOTICE`s
    level = cmake::LogLevel::LOG_NOTICE;
  }
  assert("Message log level expected to be set" &&
         level != cmake::LogLevel::LOG_UNDEFINED);

  auto desiredLevel = this->Makefile->GetCMakeInstance()->GetLogLevel();
  assert("Expected a valid log level here" &&
         desiredLevel != cmake::LogLevel::LOG_UNDEFINED);

  if (desiredLevel < level) {
    // Suppress the message
    return true;
  }

  auto message = cmJoin(cmMakeRange(i, args.cend()), "");

  if (type != MessageType::MESSAGE) {
    // we've overridden the message type, above, so display it directly
    cmMessenger* m = this->Makefile->GetMessenger();
    m->DisplayMessage(type, message, this->Makefile->GetBacktrace());
  } else {
    if (status) {
      this->Makefile->DisplayStatus(message, -1);
    } else {
      cmSystemTools::Message(message);
    }
  }
  if (fatal) {
    cmSystemTools::SetFatalErrorOccured();
  }
  return true;
}